

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_copy_into(mp_int *dest,mp_int *src)

{
  ulong uVar1;
  
  uVar1 = src->nw;
  if (dest->nw < src->nw) {
    uVar1 = dest->nw;
  }
  memmove(dest->w,src->w,uVar1 * 8);
  smemclr(dest->w + uVar1,(dest->nw - uVar1) * 8);
  return;
}

Assistant:

void mp_copy_into(mp_int *dest, mp_int *src)
{
    size_t copy_nw = size_t_min(dest->nw, src->nw);
    memmove(dest->w, src->w, copy_nw * sizeof(BignumInt));
    smemclr(dest->w + copy_nw, (dest->nw - copy_nw) * sizeof(BignumInt));
}